

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char **p;
  uchar *puVar5;
  char *pcVar6;
  ulong uVar7;
  Vdbe *pVm;
  Vdbe *p_00;
  char **ppcVar8;
  uint uVar9;
  ulong uVar10;
  sqlite3_stmt *pStmt;
  uint local_5c;
  char **local_58;
  sqlite3 *local_50;
  sqlite3_callback local_48;
  char *zLeftover;
  void *local_38;
  
  pStmt = (sqlite3_stmt *)0x0;
  local_48 = xCallback;
  local_38 = pArg;
  iVar3 = sqlite3SafetyCheckOk(db);
  if (iVar3 == 0) {
    iVar3 = sqlite3MisuseError(0x1ffa2);
    return iVar3;
  }
  pcVar6 = "";
  if (zSql != (char *)0x0) {
    pcVar6 = zSql;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3Error(db,0);
  iVar3 = 0;
LAB_00150e4e:
  do {
    do {
      if ((iVar3 != 0) || (*pcVar6 == '\0')) {
        p = (char **)0x0;
        p_00 = (Vdbe *)pStmt;
LAB_00151038:
        if (p_00 != (Vdbe *)0x0) {
          sqlite3VdbeFinalize(p_00);
        }
LAB_00151045:
        sqlite3DbFree(db,p);
        iVar3 = sqlite3ApiExit(db,iVar3);
        if ((pzErrMsg == (char **)0x0) || (iVar3 == 0)) {
          if (pzErrMsg != (char **)0x0) {
            *pzErrMsg = (char *)0x0;
          }
        }
        else {
          pcVar6 = sqlite3_errmsg(db);
          pcVar6 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar6);
          *pzErrMsg = pcVar6;
          if (pcVar6 == (char *)0x0) {
            iVar3 = 7;
            sqlite3Error(db,7);
          }
        }
        if (db->mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        }
        return iVar3;
      }
      pStmt = (sqlite3_stmt *)0x0;
      iVar3 = sqlite3_prepare_v2(db,pcVar6,-1,&pStmt,&zLeftover);
    } while (iVar3 != 0);
    if (pStmt != (sqlite3_stmt *)0x0) {
      p = (char **)0x0;
      bVar2 = false;
      local_5c = 0;
      ppcVar8 = (char **)0x0;
      p_00 = (Vdbe *)pStmt;
      local_58 = pzErrMsg;
      local_50 = db;
      do {
        iVar3 = sqlite3_step((sqlite3_stmt *)p_00);
        if (local_48 != (sqlite3_callback)0x0) {
          if (iVar3 == 100) {
            if (!bVar2) goto LAB_00150ef3;
            uVar7 = (ulong)local_5c;
            uVar9 = local_5c;
LAB_00150f4e:
            ppcVar8 = p + uVar7;
            uVar7 = 0;
            if (0 < (int)uVar9) {
              uVar7 = (ulong)uVar9;
            }
            local_5c = uVar9;
            for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
              puVar5 = sqlite3_column_text(pStmt,(int)uVar10);
              p_00 = (Vdbe *)pStmt;
              ppcVar8[uVar10] = (char *)puVar5;
              if ((puVar5 == (uchar *)0x0) &&
                 (iVar4 = sqlite3_column_type(pStmt,(int)uVar10), db = local_50, iVar4 != 5)) {
                sqlite3OomFault(local_50);
                iVar3 = 100;
                pzErrMsg = local_58;
                goto LAB_00151038;
              }
            }
            ppcVar8[uVar7] = (char *)0x0;
          }
          else {
            if (((iVar3 != 0x65) || (bVar2)) || ((db->flags & 0x100) == 0)) break;
LAB_00150ef3:
            if (p_00 == (Vdbe *)0x0) {
              uVar9 = 0;
            }
            else {
              uVar9 = (uint)p_00->nResColumn;
            }
            p = (char **)sqlite3DbMallocRaw(db,(ulong)(uVar9 << 4 | 8));
            if (p == (char **)0x0) {
              p = (char **)0x0;
              pzErrMsg = local_58;
              goto LAB_00151038;
            }
            uVar7 = (ulong)uVar9;
            local_5c = uVar9;
            for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
              pcVar6 = sqlite3_column_name((sqlite3_stmt *)p_00,(int)uVar10);
              p[uVar10] = pcVar6;
            }
            if (iVar3 == 100) goto LAB_00150f4e;
          }
          pzErrMsg = local_58;
          iVar4 = (*local_48)(local_38,local_5c,ppcVar8,p);
          db = local_50;
          if (iVar4 != 0) {
            sqlite3VdbeFinalize((Vdbe *)pStmt);
            pStmt = (sqlite3_stmt *)0x0;
            iVar3 = 4;
            sqlite3Error(db,4);
            goto LAB_00151045;
          }
          bVar2 = true;
          p_00 = (Vdbe *)pStmt;
        }
      } while (iVar3 == 100);
      iVar3 = sqlite3VdbeFinalize(p_00);
      pzErrMsg = local_58;
      pStmt = (sqlite3_stmt *)0x0;
      pcVar6 = zLeftover + -1;
      do {
        pbVar1 = (byte *)(pcVar6 + 1);
        pcVar6 = pcVar6 + 1;
      } while ((""[*pbVar1] & 1) != 0);
      sqlite3DbFree(db,p);
      goto LAB_00150e4e;
    }
    iVar3 = 0;
    pcVar6 = zLeftover;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}